

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O1

void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *pNtk)

{
  byte *pbVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pFrom;
  anon_union_8_4_f2c99bcb_for_Flow_Data_t__1 aVar3;
  uint *__ptr;
  void *pvVar4;
  uint *__ptr_00;
  Vec_Ptr_t *pVVar5;
  Abc_Obj_t *pInit;
  void *pvVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar4 = malloc(800);
  *(void **)(__ptr + 2) = pvVar4;
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[0] = 100;
  __ptr_00[1] = 0;
  pvVar4 = malloc(800);
  *(void **)(__ptr_00 + 2) = pvVar4;
  pNtk_00 = pManMR->pInitNtk;
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar9 = 0;
    do {
      pvVar4 = pVVar5->pArray[lVar9];
      if ((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 5)) {
        pFrom = pManMR->pDataArray[*(uint *)((long)pvVar4 + 0x10)].field_1.pred;
        if ((*(uint *)&pFrom->field_0x14 & 0xf) != 2) {
          __assert_fail("Abc_ObjIsPi(pInitObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x2a5,"void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *)");
        }
        pInit = Abc_NtkCreateNodeBuf(pNtk_00,(Abc_Obj_t *)0x0);
        Abc_FlowRetime_ClearInitToOrig(pInit);
        Abc_ObjBetterTransferFanout(pFrom,pInit,0);
        pManMR->pDataArray[*(uint *)((long)pvVar4 + 0x10)].field_1.pred = pInit;
        *(byte *)((long)pvVar4 + 0x14) = *(byte *)((long)pvVar4 + 0x14) | 0x10;
        uVar2 = __ptr[1];
        uVar8 = *__ptr;
        if (uVar2 == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar6 = malloc(0x80);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar10 = 0x10;
          }
          else {
            uVar10 = uVar8 * 2;
            if ((int)uVar10 <= (int)uVar8) goto LAB_004d3391;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar6 = malloc((ulong)uVar8 << 4);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr + 2),(ulong)uVar8 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar6;
          *__ptr = uVar10;
        }
LAB_004d3391:
        __ptr[1] = uVar2 + 1;
        *(void **)(*(long *)(__ptr + 2) + (long)(int)uVar2 * 8) = pvVar4;
        uVar2 = __ptr_00[1];
        uVar8 = *__ptr_00;
        if (uVar2 == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar4 = malloc(0x80);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr_00 + 2),0x80);
            }
            uVar10 = 0x10;
          }
          else {
            uVar10 = uVar8 * 2;
            if ((int)uVar10 <= (int)uVar8) goto LAB_004d33ff;
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar4 = malloc((ulong)uVar8 << 4);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar8 << 4);
            }
          }
          *(void **)(__ptr_00 + 2) = pvVar4;
          *__ptr_00 = uVar10;
        }
LAB_004d33ff:
        __ptr_00[1] = uVar2 + 1;
        *(Abc_Obj_t **)(*(long *)(__ptr_00 + 2) + (long)(int)uVar2 * 8) = pFrom;
      }
      lVar9 = lVar9 + 1;
      pVVar5 = pNtk->vObjs;
    } while (lVar9 < pVVar5->nSize);
  }
  pVVar5 = pNtk_00->vPis;
  lVar9 = (long)pVVar5->nSize;
  if (0 < lVar9) {
    lVar7 = 0;
    do {
      if (*(int *)((long)pVVar5->pArray[lVar7] + 0x2c) != 0) {
        __assert_fail("Abc_ObjFanoutNum( pInitObj ) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x2b8,"void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *)");
      }
      lVar7 = lVar7 + 1;
    } while (lVar9 != lVar7);
  }
  pVVar5 = pNtk->vBoxes;
  if (0 < pVVar5->nSize) {
    lVar9 = 0;
    do {
      pvVar4 = pVVar5->pArray[lVar9];
      uVar2 = *(uint *)((long)pvVar4 + 0x14);
      if ((uVar2 & 0xf) == 8) {
        if ((int)__ptr_00[1] < 1) {
          __assert_fail("Vec_PtrSize(vPi) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x2bd,"void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *)");
        }
        uVar8 = __ptr_00[1] - 1;
        __ptr_00[1] = uVar8;
        aVar3 = *(anon_union_8_4_f2c99bcb_for_Flow_Data_t__1 *)
                 (*(long *)(__ptr_00 + 2) + (ulong)uVar8 * 8);
        *(uint *)((long)pvVar4 + 0x14) = uVar2 | 0x30;
        pManMR->pDataArray[*(uint *)((long)pvVar4 + 0x10)].field_1 = aVar3;
        *(anon_union_8_4_f2c99bcb_for_Flow_Data_t__1 *)((long)pvVar4 + 0x38) = aVar3;
      }
      lVar9 = lVar9 + 1;
      pVVar5 = pNtk->vBoxes;
    } while (lVar9 < pVVar5->nSize);
  }
  uVar2 = __ptr[1];
  if (0 < (long)(int)uVar2) {
    lVar9 = *(long *)(__ptr + 2);
    lVar7 = 0;
    do {
      Abc_FlowRetime_UpdateBackwardInit_rec(*(Abc_Obj_t **)(lVar9 + lVar7 * 8));
      lVar7 = lVar7 + 1;
    } while ((int)uVar2 != lVar7);
  }
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar9 = 0;
    do {
      if (pVVar5->pArray[lVar9] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar5->pArray[lVar9] + 0x14);
        *pbVar1 = *pbVar1 & 0xcf;
      }
      lVar9 = lVar9 + 1;
      pVVar5 = pNtk->vObjs;
    } while (lVar9 < pVVar5->nSize);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
  }
  free(__ptr_00);
  return;
}

Assistant:

void Abc_FlowRetime_UpdateBackwardInit( Abc_Ntk_t * pNtk ) {
  Abc_Obj_t *pOrigObj,  *pInitObj;
  Vec_Ptr_t *vBo = Vec_PtrAlloc(100);
  Vec_Ptr_t *vPi = Vec_PtrAlloc(100);
  Abc_Ntk_t *pInitNtk = pManMR-> pInitNtk;
  Abc_Obj_t *pBuf;
  int i;

  // remove PIs from network (from BOs)
  Abc_NtkForEachObj( pNtk, pOrigObj, i )
    if (Abc_ObjIsBo(pOrigObj)) {
      pInitObj = FDATA(pOrigObj)->pInitObj;
      assert(Abc_ObjIsPi(pInitObj));

      // DEBUG
      // printf("update : freeing PI %d\n", pInitObj->Id);
      
      // create a buffer instead
      pBuf = Abc_NtkCreateNodeBuf( pInitNtk, NULL );
      Abc_FlowRetime_ClearInitToOrig( pBuf );

      Abc_ObjBetterTransferFanout( pInitObj, pBuf, 0 );
      FDATA(pOrigObj)->pInitObj = pBuf;
      pOrigObj->fMarkA = 1;

      Vec_PtrPush(vBo, pOrigObj);
      Vec_PtrPush(vPi, pInitObj);
    }
  
  // check that PIs are all free
  Abc_NtkForEachPi( pInitNtk, pInitObj, i) {
    assert( Abc_ObjFanoutNum( pInitObj ) == 0);
  }

  // add PIs to to latches
  Abc_NtkForEachLatch( pNtk, pOrigObj, i ) {
    assert(Vec_PtrSize(vPi) > 0);
    pInitObj = (Abc_Obj_t*)Vec_PtrPop(vPi);

    // DEBUG
    // printf("update : mapping latch %d to PI %d\n", pOrigObj->Id, pInitObj->Id);

    pOrigObj->fMarkA = pOrigObj->fMarkB = 1;
    FDATA(pOrigObj)->pInitObj = pInitObj;
    Abc_ObjSetData(pOrigObj, pInitObj);
  }  

  // recursively build init network
  Vec_PtrForEachEntry( Abc_Obj_t *, vBo, pOrigObj, i )
    Abc_FlowRetime_UpdateBackwardInit_rec( pOrigObj );
  
  // clear flags
  Abc_NtkForEachObj( pNtk, pOrigObj, i )
    pOrigObj->fMarkA = pOrigObj->fMarkB = 0;

  // deallocate
  Vec_PtrFree( vBo );
  Vec_PtrFree( vPi );
}